

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O2

econf_err setStringValueNum(econf_file *ef,size_t num,void *v)

{
  econf_err eVar1;
  char *pcVar2;
  
  pcVar2 = "";
  if (v != (void *)0x0) {
    pcVar2 = (char *)v;
  }
  pcVar2 = strdup(pcVar2);
  if (pcVar2 == (char *)0x0) {
    eVar1 = ECONF_NOMEM;
  }
  else {
    free(ef->file_entry[num].value);
    ef->file_entry[num].value = pcVar2;
    eVar1 = ECONF_SUCCESS;
  }
  return eVar1;
}

Assistant:

econf_err setStringValueNum(econf_file *ef, size_t num, const void *v) {
  const char *value = (const char*) (v ? v : "");
  char *ptr;

  if ((ptr = strdup (value)) == NULL)
    return ECONF_NOMEM;

  if (ef->file_entry[num].value)
    free(ef->file_entry[num].value);

  ef->file_entry[num].value = ptr;

  return ECONF_SUCCESS;
}